

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

Dar_Lib_t * Dar_LibAlloc(int nObjs)

{
  Dar_Lib_t *__s;
  Dar_LibObj_t *pDVar1;
  char **ppcVar2;
  int local_34;
  int i;
  Dar_Lib_t *p;
  uint uTruths [4];
  int nObjs_local;
  
  uTruths[0] = 0xf0f0;
  uTruths[1] = 0xff00;
  __s = (Dar_Lib_t *)malloc(0x3f18);
  memset(__s,0,0x3f18);
  __s->nObjs = nObjs;
  pDVar1 = (Dar_LibObj_t *)malloc((long)nObjs << 3);
  __s->pObjs = pDVar1;
  memset(__s->pObjs,0,(long)nObjs << 3);
  ppcVar2 = Dar_Permutations(4);
  __s->pPerms4 = ppcVar2;
  Dar_Truth4VarNPN(&__s->puCanons,&__s->pPhases,&__s->pPerms,&__s->pMap);
  __s->iObj = 4;
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    __s->pObjs[local_34] =
         (Dar_LibObj_t)((ulong)__s->pObjs[local_34] & 0xfffffff7ffffffff | 0x800000000);
    __s->pObjs[local_34] =
         (Dar_LibObj_t)
         ((ulong)__s->pObjs[local_34] & 0xfffffffff | (ulong)uTruths[(long)local_34 + -2] << 0x24);
  }
  return __s;
}

Assistant:

Dar_Lib_t * Dar_LibAlloc( int nObjs )
{
    unsigned uTruths[4] = { 0xAAAA, 0xCCCC, 0xF0F0, 0xFF00 };
    Dar_Lib_t * p;
    int i;//, clk = Abc_Clock();
    p = ABC_ALLOC( Dar_Lib_t, 1 );
    memset( p, 0, sizeof(Dar_Lib_t) );
    // allocate objects
    p->nObjs = nObjs;
    p->pObjs = ABC_ALLOC( Dar_LibObj_t, nObjs );
    memset( p->pObjs, 0, sizeof(Dar_LibObj_t) * nObjs );
    // allocate canonical data
    p->pPerms4 = Dar_Permutations( 4 );
    Dar_Truth4VarNPN( &p->puCanons, &p->pPhases, &p->pPerms, &p->pMap );
    // start the elementary objects
    p->iObj = 4;
    for ( i = 0; i < 4; i++ )
    {
        p->pObjs[i].fTerm = 1;
        p->pObjs[i].Num = uTruths[i];
    }
//    ABC_PRT( "Library start", Abc_Clock() - clk );
    return p;
}